

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

string * __thiscall
cmCTestSubmitHandler::ResponseParser::GetCurrentValue_abi_cxx11_
          (string *__return_storage_ptr__,ResponseParser *this)

{
  bool bVar1;
  char *pcVar2;
  ResponseParser *this_local;
  string *val;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CurrentValue);
  if (!bVar1) {
    pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->CurrentValue);
    std::vector<char,_std::allocator<char>_>::size(&this->CurrentValue);
    std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetCurrentValue()
  {
    std::string val;
    if (!this->CurrentValue.empty()) {
      val.assign(this->CurrentValue.data(), this->CurrentValue.size());
    }
    return val;
  }